

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

char * SoapySDRDevice_getHardwareKey(SoapySDRDevice *device)

{
  long *in_RDI;
  exception *ex;
  string *in_stack_ffffffffffffffc0;
  string local_30 [32];
  long *local_10;
  char *local_8;
  
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  (**(code **)(*local_10 + 0x18))(local_30);
  local_8 = toCString(in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

char *SoapySDRDevice_getHardwareKey(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return toCString(device->getHardwareKey());
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}